

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

FlagBase * __thiscall args::FlagBase::Match(FlagBase *this,string *flag)

{
  const_iterator cVar1;
  ostream *poVar2;
  runtime_error *this_00;
  ostringstream problem;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->matcher).longFlags._M_h,flag);
  if (cVar1.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    this = (FlagBase *)0x0;
  }
  else {
    if (((this->super_NamedBase).field_0x51 == '\x01') &&
       ((this->super_NamedBase).super_Base.matched == true)) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Flag \'",6);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,(flag->_M_dataplus)._M_p,flag->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\' was passed multiple times, but is only allowed to be passed once",0x42);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1b0);
      *(undefined ***)this_00 = &PTR__runtime_error_00131568;
      __cxa_throw(this_00,&ExtraError::typeinfo,std::runtime_error::~runtime_error);
    }
    (this->super_NamedBase).super_Base.matched = true;
  }
  return this;
}

Assistant:

virtual FlagBase *Match(const std::string &flag)
            {
                if (matcher.Match(flag))
                {
                    if (extraError && matched)
                    {
#ifdef ARGS_NOEXCEPT
                        error = Error::Extra;
#else
                        std::ostringstream problem;
                        problem << "Flag '" << flag << "' was passed multiple times, but is only allowed to be passed once";
                        throw ExtraError(problem.str());
#endif
                    }
                    matched = true;
                    return this;
                }
                return nullptr;
            }